

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

void __thiscall
inipp::Ini<wchar_t>::parse
          (Ini<wchar_t> *this,basic_istream<wchar_t,_std::char_traits<wchar_t>_> *is)

{
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __end;
  bool bVar1;
  uint uVar2;
  wistream *pwVar3;
  element_type *peVar4;
  uint *puVar5;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __beg;
  bool local_1a1;
  _Self local_158;
  _Self local_150;
  map<std::__cxx11::wstring,std::__cxx11::wstring,std::less<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>>>
  *local_148;
  mapped_type *sec;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_138;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_130;
  undefined1 local_128 [8];
  String value;
  undefined1 local_f0 [8];
  String variable;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_c8;
  wstring local_c0 [32];
  uint *local_a0;
  value_type *front;
  wchar_t *local_90;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_88;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_80;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  pos;
  size_type length;
  locale local_60 [8];
  locale loc;
  String section;
  String line;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *is_local;
  Ini<wchar_t> *this_local;
  
  std::__cxx11::wstring::wstring((wstring *)((long)&section.field_2 + 8));
  std::__cxx11::wstring::wstring((wstring *)&loc);
  std::locale::locale(local_60,"C");
  while( true ) {
    pwVar3 = std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                       ((wistream *)is,(wstring *)((long)&section.field_2 + 8));
    bVar1 = std::wios::operator_cast_to_bool((wios *)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18)));
    if (!bVar1) break;
    detail::ltrim<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&section.field_2 + 8),local_60);
    detail::rtrim<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&section.field_2 + 8),local_60);
    pos._M_current = (wchar_t *)std::__cxx11::wstring::length();
    if (pos._M_current != (wchar_t *)0x0) {
      local_88._M_current = (wchar_t *)std::__cxx11::wstring::begin();
      local_90 = (wchar_t *)std::__cxx11::wstring::end();
      front = (value_type *)this;
      local_80 = std::
                 find_if<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,inipp::Ini<wchar_t>::parse(std::wistream&)::_lambda(wchar_t)_1_>
                           (local_88,(__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                                      )local_90,(anon_class_8_1_8991fb9c_for__M_pred_conflict)this);
      local_a0 = (uint *)std::__cxx11::wstring::front();
      peVar4 = std::
               __shared_ptr_access<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->format);
      uVar2 = (*peVar4->_vptr_Format[3])(peVar4,(ulong)*local_a0);
      if ((uVar2 & 1) == 0) {
        peVar4 = std::
                 __shared_ptr_access<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->format);
        uVar2 = (**peVar4->_vptr_Format)(peVar4,(ulong)*local_a0);
        if ((uVar2 & 1) == 0) {
          local_c8._M_current = (wchar_t *)std::__cxx11::wstring::begin();
          bVar1 = __gnu_cxx::operator!=(&local_80,&local_c8);
          local_1a1 = false;
          if (bVar1) {
            variable.field_2._8_8_ = std::__cxx11::wstring::end();
            local_1a1 = __gnu_cxx::operator!=
                                  (&local_80,
                                   (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                                    *)((long)&variable.field_2 + 8));
          }
          if (local_1a1 == false) {
            std::__cxx11::
            list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::push_back(&this->errors,(value_type *)((long)&section.field_2 + 8));
          }
          else {
            __beg._M_current = (wchar_t *)std::__cxx11::wstring::begin();
            __end._M_current = local_80._M_current;
            std::allocator<wchar_t>::allocator();
            std::__cxx11::wstring::
            wstring<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
                      ((wstring *)local_f0,__beg,__end,
                       (allocator<wchar_t> *)((long)&value.field_2 + 0xf));
            std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&value.field_2 + 0xf));
            local_130 = __gnu_cxx::
                        __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        ::operator+(&local_80,1);
            local_138._M_current = (wchar_t *)std::__cxx11::wstring::end();
            std::allocator<wchar_t>::allocator();
            std::__cxx11::wstring::
            wstring<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
                      ((wstring *)local_128,local_130,local_138,
                       (allocator<wchar_t> *)((long)&sec + 7));
            std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&sec + 7));
            detail::rtrim<wchar_t>
                      ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )local_f0,local_60);
            detail::ltrim<wchar_t>
                      ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )local_128,local_60);
            local_148 = (map<std::__cxx11::wstring,std::__cxx11::wstring,std::less<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>>>
                         *)std::
                           map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>_>_>
                           ::operator[](&this->sections,(key_type *)&loc);
            local_150._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ::find((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                         *)local_148,(key_type *)local_f0);
            local_158._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                        *)local_148);
            bVar1 = std::operator==(&local_150,&local_158);
            if (bVar1) {
              std::
              map<std::__cxx11::wstring,std::__cxx11::wstring,std::less<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,std::__cxx11::wstring>>>
              ::emplace<std::__cxx11::wstring&,std::__cxx11::wstring&>
                        (local_148,
                         (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)local_f0,
                         (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)local_128);
            }
            else {
              std::__cxx11::
              list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ::push_back(&this->errors,(value_type *)((long)&section.field_2 + 8));
            }
            std::__cxx11::wstring::~wstring((wstring *)local_128);
            std::__cxx11::wstring::~wstring((wstring *)local_f0);
          }
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->format);
          puVar5 = (uint *)std::__cxx11::wstring::back();
          uVar2 = (*peVar4->_vptr_Format[1])(peVar4,(ulong)*puVar5);
          if ((uVar2 & 1) == 0) {
            std::__cxx11::
            list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::push_back(&this->errors,(value_type *)((long)&section.field_2 + 8));
          }
          else {
            std::__cxx11::wstring::substr((ulong)local_c0,(ulong)((long)&section.field_2 + 8));
            std::__cxx11::wstring::operator=((wstring *)&loc,local_c0);
            std::__cxx11::wstring::~wstring(local_c0);
          }
        }
      }
    }
  }
  std::locale::~locale(local_60);
  std::__cxx11::wstring::~wstring((wstring *)&loc);
  std::__cxx11::wstring::~wstring((wstring *)((long)&section.field_2 + 8));
  return;
}

Assistant:

void parse(std::basic_istream<CharT> & is) {
		String line;
		String section;
		const std::locale loc{"C"};
		while (std::getline(is, line)) {
			detail::ltrim(line, loc);
			detail::rtrim(line, loc);
			const auto length = line.length();
			if (length > 0) {
				const auto pos = std::find_if(line.begin(), line.end(), [this](CharT ch) { return format->is_assign(ch); });
				const auto & front = line.front();
				if (format->is_comment(front)) {
				}
				else if (format->is_section_start(front)) {
					if (format->is_section_end(line.back()))
						section = line.substr(1, length - 2);
					else
						errors.push_back(line);
				}
				else if (pos != line.begin() && pos != line.end()) {
					String variable(line.begin(), pos);
					String value(pos + 1, line.end());
					detail::rtrim(variable, loc);
					detail::ltrim(value, loc);
					auto & sec = sections[section];
					if (sec.find(variable) == sec.end())
						sec.emplace(variable, value);
					else
						errors.push_back(line);
				}
				else {
					errors.push_back(line);
				}
			}
		}
	}